

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

void __thiscall AliasChecker::gather(AliasChecker *this,Funcdata *f,AddrSpace *spc,bool defer)

{
  uint uVar1;
  FuncProto *proto;
  int4 iVar2;
  bool defer_local;
  AddrSpace *spc_local;
  Funcdata *f_local;
  AliasChecker *this_local;
  
  this->fd = f;
  this->space = spc;
  this->calculated = false;
  std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::clear(&this->addBase);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->alias);
  uVar1 = (*this->space->_vptr_AddrSpace[5])();
  iVar2 = -1;
  if ((uVar1 & 1) != 0) {
    iVar2 = 1;
  }
  this->direction = iVar2;
  proto = Funcdata::getFuncProto(this->fd);
  deriveBoundaries(this,proto);
  if (!defer) {
    gatherInternal(this);
  }
  return;
}

Assistant:

void AliasChecker::gather(const Funcdata *f,AddrSpace *spc,bool defer)

{
  fd = f;
  space = spc;
  calculated = false;		// Defer calculation
  addBase.clear();
  alias.clear();
  direction = space->stackGrowsNegative() ? 1 : -1;		// direction == 1 for normal negative stack growth
  deriveBoundaries(fd->getFuncProto());
  if (!defer)
    gatherInternal();
}